

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetBgColor(ImGuiTableBgTarget target,ImU32 color,int column_n)

{
  float *pfVar1;
  ImGuiTable *pIVar2;
  ImGuiTableCellData *pIVar3;
  int bg_idx;
  ImGuiTableCellData *cell_data;
  ImGuiTable *table;
  ImGuiContext *g;
  ImU32 local_10;
  int column_n_local;
  ImU32 color_local;
  ImGuiTableBgTarget target_local;
  
  pIVar2 = GImGui->CurrentTable;
  if (target == 0) {
    __assert_fail("target != ImGuiTableBgTarget_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_tables.cpp"
                  ,0x63f,"void ImGui::TableSetBgColor(ImGuiTableBgTarget, ImU32, int)");
  }
  local_10 = color;
  if (color == 0x1000000) {
    local_10 = 0;
  }
  if (target - 1U < 2) {
    pfVar1 = &(pIVar2->InnerClipRect).Max.y;
    if (pIVar2->RowPosY1 < *pfVar1 || pIVar2->RowPosY1 == *pfVar1) {
      if (column_n != -1) {
        __assert_fail("column_n == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_tables.cpp"
                      ,0x65b,"void ImGui::TableSetBgColor(ImGuiTableBgTarget, ImU32, int)");
      }
      pIVar2->RowBgColor[(int)(uint)(target == 2)] = local_10;
    }
  }
  else {
    if (target != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_tables.cpp"
                    ,0x661,"void ImGui::TableSetBgColor(ImGuiTableBgTarget, ImU32, int)");
    }
    pfVar1 = &(pIVar2->InnerClipRect).Max.y;
    if (pIVar2->RowPosY1 < *pfVar1 || pIVar2->RowPosY1 == *pfVar1) {
      g._4_4_ = column_n;
      if (column_n == -1) {
        g._4_4_ = pIVar2->CurrentColumn;
      }
      if ((pIVar2->VisibleMaskByIndex & 1L << ((byte)g._4_4_ & 0x3f)) != 0) {
        if ((pIVar2->RowCellDataCurrent < '\0') ||
           (pIVar3 = ImSpan<ImGuiTableCellData>::operator[]
                               (&pIVar2->RowCellData,(int)pIVar2->RowCellDataCurrent),
           pIVar3->Column != g._4_4_)) {
          pIVar2->RowCellDataCurrent = pIVar2->RowCellDataCurrent + '\x01';
        }
        pIVar3 = ImSpan<ImGuiTableCellData>::operator[]
                           (&pIVar2->RowCellData,(int)pIVar2->RowCellDataCurrent);
        pIVar3->BgColor = local_10;
        pIVar3->Column = (byte)g._4_4_;
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableSetBgColor(ImGuiTableBgTarget target, ImU32 color, int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(target != ImGuiTableBgTarget_None);

    if (color == IM_COL32_DISABLE)
        color = 0;

    // We cannot draw neither the cell or row background immediately as we don't know the row height at this point in time.
    switch (target)
    {
    case ImGuiTableBgTarget_CellBg:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        if (column_n == -1)
            column_n = table->CurrentColumn;
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            return;
        if (table->RowCellDataCurrent < 0 || table->RowCellData[table->RowCellDataCurrent].Column != column_n)
            table->RowCellDataCurrent++;
        ImGuiTableCellData* cell_data = &table->RowCellData[table->RowCellDataCurrent];
        cell_data->BgColor = color;
        cell_data->Column = (ImGuiTableColumnIdx)column_n;
        break;
    }
    case ImGuiTableBgTarget_RowBg0:
    case ImGuiTableBgTarget_RowBg1:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        IM_ASSERT(column_n == -1);
        int bg_idx = (target == ImGuiTableBgTarget_RowBg1) ? 1 : 0;
        table->RowBgColor[bg_idx] = color;
        break;
    }
    default:
        IM_ASSERT(0);
    }
}